

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

void __thiscall wasm::CallRef::finalize(CallRef *this)

{
  handleUnreachableOperands<wasm::CallRef>(this);
  if (this->isReturn == true) {
    (this->super_SpecificExpression<(wasm::Expression::Id)56>).super_Expression.type.id = 1;
  }
  if ((this->target->type).id == 1) {
    (this->super_SpecificExpression<(wasm::Expression::Id)56>).super_Expression.type.id = 1;
  }
  return;
}

Assistant:

void CallRef::finalize() {
  handleUnreachableOperands(this);
  if (isReturn) {
    type = Type::unreachable;
  }
  if (target->type == Type::unreachable) {
    type = Type::unreachable;
  }
}